

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O3

void __thiscall xray_re::xr_visual_object::load(xr_visual_object *this,xr_reader *r)

{
  float *pfVar1;
  uint32_t *puVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uint16_t version;
  ushort local_12;
  
  local_12 = (ushort)((ulong)in_RAX >> 0x30);
  sVar3 = xr_reader::r_raw_chunk(r,0x900,&local_12,2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                  ,0x12,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
  }
  if ((local_12 & 0xfffe) != 0x10) {
    __assert_fail("version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                  ,0x13,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
  }
  if (local_12 == 0x10) {
    sVar3 = xr_reader::find_chunk(r,0x904);
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                    ,0x17,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
    }
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_position.field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_position.field_0.field_0.y = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_position.field_0.field_0.z = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_rotation.field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_rotation.field_0.field_0.y = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_rotation.field_0.field_0.z = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_scale.field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_scale.field_0.field_0.y = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->super_xr_custom_object).m_scale.field_0.field_0.z = *pfVar1;
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar3 = xr_reader::find_chunk(r,0x902);
  if (sVar3 != 0) {
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = *puVar2;
    (r->field_2).m_p = (r->field_2).m_p + 4;
    xr_reader::r_sz(r,&this->m_reference);
    xr_reader::r_raw_chunk(r,0x905,&this->m_flags,4);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                ,0x21,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
}

Assistant:

void xr_visual_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION);

	if (version == SCENEOBJ_VERSION_16) {
		if (!r.find_chunk(SCENEOBJ_CHUNK_PLACEMENT))
			xr_not_expected();
		r.r_fvector3(co_position());
		r.r_fvector3(co_rotation());
		r.r_fvector3(co_scale());
		r.debug_find_chunk();
	}

	xr_custom_object::load(r);

	if (!r.find_chunk(SCENEOBJ_CHUNK_REFERENCE))
		xr_not_expected();
	m_file_version = r.r_u32();
	r.r_u32();
	r.r_sz(m_reference);
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}